

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  Context *context;
  EnumDescriptor *pEVar1;
  Printer *pPVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  string *psVar7;
  size_type sVar8;
  reference ppEVar9;
  ulong uVar10;
  mapped_type *pmVar11;
  EnumValueOptions *this_00;
  FileDescriptor *pFVar12;
  reference pvVar13;
  EnumValueDescriptor *pEVar14;
  Descriptor *pDVar15;
  MessageOptions *this_01;
  int __c;
  int __c_00;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  int __c_01;
  int i_04;
  int __c_02;
  int i_05;
  char *pcVar16;
  ClassNameResolver *pCVar17;
  int local_37c;
  undefined1 local_378 [4];
  int i_5;
  allocator local_351;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  int local_2b0;
  allocator local_2a9;
  int i_4;
  string local_288;
  allocator local_261;
  key_type local_260;
  undefined1 local_240 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_2;
  int i_3;
  allocator local_1e1;
  key_type local_1e0;
  allocator local_1b9;
  key_type local_1b8;
  undefined1 local_198 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_1;
  int i_2;
  string local_140;
  allocator local_119;
  key_type local_118;
  string local_f8;
  allocator local_d1;
  key_type local_d0;
  undefined1 local_b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  int local_78;
  int i_1;
  int i;
  string index_text;
  bool ordinal_is_index;
  allocator local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  WriteEnumDocComment(printer,this->descriptor_);
  pPVar2 = local_18;
  context = this->context_;
  pEVar1 = this->descriptor_;
  bVar3 = this->immutable_api_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,pPVar2,pEVar1,(bool)(bVar3 & 1),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pPVar2 = local_18;
  psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(pPVar2,
                     "public enum $classname$\n    implements com.google.protobuf.ProtocolMessageEnum {\n"
                     ,"classname",psVar7);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>(local_18,"classname",this->descriptor_);
  io::Printer::Indent(local_18);
  index_text.field_2._M_local_buf[0xb] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"ordinal()",(allocator *)((long)&i_1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
  local_78 = 0;
  do {
    sVar8 = std::
            vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ::size(&this->canonical_values_);
    if (sVar8 <= (ulong)(long)local_78) {
LAB_004594f0:
      for (vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
          uVar10 = (ulong)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
          sVar8 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::size(&this->canonical_values_), uVar10 < sVar8;
          vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
               vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b0);
        ppEVar9 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::operator[](&this->canonical_values_,
                               (long)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        psVar7 = EnumValueDescriptor::name_abi_cxx11_(*ppEVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d0,"name",&local_d1);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_b0,&local_d0);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)psVar7);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        pcVar16 = (char *)(long)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        ppEVar9 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::operator[](&this->canonical_values_,(size_type)pcVar16);
        pcVar16 = EnumValueDescriptor::index(*ppEVar9,pcVar16,__c_00);
        SimpleItoa_abi_cxx11_(&local_f8,(protobuf *)((ulong)pcVar16 & 0xffffffff),i_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_118,"index",&local_119);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_b0,&local_118);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        std::__cxx11::string::~string((string *)&local_f8);
        ppEVar9 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::operator[](&this->canonical_values_,
                               (long)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        uVar4 = EnumValueDescriptor::number(*ppEVar9);
        SimpleItoa_abi_cxx11_(&local_140,(protobuf *)(ulong)uVar4,i_01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&i_2,"number",
                   (allocator *)((long)&vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_b0,(key_type *)&i_2);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_140);
        std::__cxx11::string::~string((string *)&i_2);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::__cxx11::string::~string((string *)&local_140);
        pPVar2 = local_18;
        ppEVar9 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::operator[](&this->canonical_values_,
                               (long)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        WriteEnumValueDocComment(pPVar2,*ppEVar9);
        ppEVar9 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::operator[](&this->canonical_values_,
                               (long)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        this_00 = EnumValueDescriptor::options(*ppEVar9);
        bVar3 = EnumValueOptions::deprecated(this_00);
        if (bVar3) {
          io::Printer::Print(local_18,"@java.lang.Deprecated\n");
        }
        if ((index_text.field_2._M_local_buf[0xb] & 1U) == 0) {
          io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_b0,"$name$($index$, $number$),\n");
        }
        else {
          io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_b0,"$name$($number$),\n");
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_b0);
      }
      pFVar12 = EnumDescriptor::file(this->descriptor_);
      bVar3 = SupportUnknownEnumValue(pFVar12);
      if (bVar3) {
        if ((index_text.field_2._M_local_buf[0xb] & 1U) == 0) {
          io::Printer::Print(local_18,"UNRECOGNIZED(-1, -1),\n");
        }
        else {
          io::Printer::Print(local_18,"UNRECOGNIZED(-1),\n");
        }
      }
      io::Printer::Print(local_18,";\n\n");
      for (vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          uVar10 = (ulong)(int)vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
          sVar8 = std::
                  vector<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                  ::size(&this->aliases_), uVar10 < sVar8;
          vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               (int)vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_198);
        psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1b8,"classname",&local_1b9);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_198,&local_1b8);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)psVar7);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        pvVar13 = std::
                  vector<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                  ::operator[](&this->aliases_,
                               (long)(int)vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar7 = EnumValueDescriptor::name_abi_cxx11_(pvVar13->value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1e0,"name",&local_1e1);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_198,&local_1e0);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)psVar7);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        pvVar13 = std::
                  vector<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                  ::operator[](&this->aliases_,
                               (long)(int)vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar7 = EnumValueDescriptor::name_abi_cxx11_(pvVar13->canonical_value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&i_3,"canonical_name",
                   (allocator *)((long)&vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_198,(key_type *)&i_3);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)psVar7);
        std::__cxx11::string::~string((string *)&i_3);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        pPVar2 = local_18;
        pvVar13 = std::
                  vector<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                  ::operator[](&this->aliases_,
                               (long)(int)vars_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
        WriteEnumValueDocComment(pPVar2,pvVar13->value);
        io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_198,
                           "public static final $classname$ $name$ = $canonical_name$;\n");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_198);
      }
      for (vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          iVar6 = (int)vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count,
          iVar5 = EnumDescriptor::value_count(this->descriptor_), iVar6 < iVar5;
          vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               (int)vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_240);
        pEVar14 = EnumDescriptor::value
                            (this->descriptor_,
                             (int)vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar7 = EnumValueDescriptor::name_abi_cxx11_(pEVar14);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_260,"name",&local_261);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_240,&local_260);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)psVar7);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
        pEVar14 = EnumDescriptor::value
                            (this->descriptor_,
                             (int)vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count);
        uVar4 = EnumValueDescriptor::number(pEVar14);
        SimpleItoa_abi_cxx11_(&local_288,(protobuf *)(ulong)uVar4,i_02);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&i_4,"number",&local_2a9);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_240,(key_type *)&i_4);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_288);
        std::__cxx11::string::~string((string *)&i_4);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
        std::__cxx11::string::~string((string *)&local_288);
        pPVar2 = local_18;
        pEVar14 = EnumDescriptor::value
                            (this->descriptor_,
                             (int)vars_2._M_t._M_impl.super__Rb_tree_header._M_node_count);
        WriteEnumValueDocComment(pPVar2,pEVar14);
        io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_240,
                           "public static final int $name$_VALUE = $number$;\n");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_240);
      }
      io::Printer::Print(local_18,"\n");
      io::Printer::Print(local_18,"\npublic final int getNumber() {\n");
      pFVar12 = EnumDescriptor::file(this->descriptor_);
      bVar3 = SupportUnknownEnumValue(pFVar12);
      if (bVar3) {
        if ((index_text.field_2._M_local_buf[0xb] & 1U) == 0) {
          io::Printer::Print(local_18,
                             "  if (index == -1) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
                            );
        }
        else {
          io::Printer::Print(local_18,
                             "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
                            );
        }
      }
      pPVar2 = local_18;
      psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(pPVar2,
                         "  return value;\n}\n\n/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $classname$ forNumber(int value) {\n  switch (value) {\n"
                         ,"classname",psVar7);
      io::Printer::Indent(local_18);
      io::Printer::Indent(local_18);
      for (local_2b0 = 0; uVar10 = (ulong)local_2b0,
          sVar8 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::size(&this->canonical_values_), pPVar2 = local_18, uVar10 < sVar8;
          local_2b0 = local_2b0 + 1) {
        ppEVar9 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::operator[](&this->canonical_values_,(long)local_2b0);
        psVar7 = EnumValueDescriptor::name_abi_cxx11_(*ppEVar9);
        ppEVar9 = std::
                  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::operator[](&this->canonical_values_,(long)local_2b0);
        uVar4 = EnumValueDescriptor::number(*ppEVar9);
        SimpleItoa_abi_cxx11_(&local_2d0,(protobuf *)(ulong)uVar4,i_03);
        io::Printer::Print(pPVar2,"case $number$: return $name$;\n","name",psVar7,"number",
                           &local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      io::Printer::Outdent(local_18);
      io::Printer::Outdent(local_18);
      pPVar2 = local_18;
      psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(pPVar2,
                         "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\n"
                         ,"classname",psVar7);
      pEVar1 = this->descriptor_;
      bVar3 = Context::EnforceLite(this->context_);
      bVar3 = HasDescriptorMethods(pEVar1,bVar3);
      if (bVar3) {
        io::Printer::Print(local_18,
                           "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n    getValueDescriptor() {\n  return getDescriptor().getValues().get($index_text$);\n}\npublic final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\npublic static final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptor() {\n"
                           ,"index_text",(string *)&i);
        pDVar15 = EnumDescriptor::containing_type(this->descriptor_);
        pPVar2 = local_18;
        if (pDVar15 == (Descriptor *)0x0) {
          pCVar17 = this->name_resolver_;
          pFVar12 = EnumDescriptor::file(this->descriptor_);
          ClassNameResolver::GetClassName_abi_cxx11_
                    (&local_2f0,pCVar17,pFVar12,(bool)(this->immutable_api_ & 1));
          pcVar16 = EnumDescriptor::index(this->descriptor_,(char *)pCVar17,__c_01);
          SimpleItoa_abi_cxx11_(&local_310,(protobuf *)((ulong)pcVar16 & 0xffffffff),i_04);
          io::Printer::Print(pPVar2,"  return $file$.getDescriptor().getEnumTypes().get($index$);\n"
                             ,"file",&local_2f0,"index",&local_310);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_2f0);
        }
        else {
          pCVar17 = this->name_resolver_;
          pDVar15 = EnumDescriptor::containing_type(this->descriptor_);
          ClassNameResolver::GetClassName_abi_cxx11_
                    (&local_330,pCVar17,pDVar15,(bool)(this->immutable_api_ & 1));
          pDVar15 = EnumDescriptor::containing_type(this->descriptor_);
          this_01 = Descriptor::options(pDVar15);
          bVar3 = MessageOptions::no_standard_descriptor_accessor(this_01);
          pcVar16 = "getDescriptor()";
          if (bVar3) {
            pcVar16 = "getDefaultInstance().getDescriptorForType()";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_350,pcVar16,&local_351);
          pcVar16 = EnumDescriptor::index(this->descriptor_,pcVar16,__c_02);
          SimpleItoa_abi_cxx11_((string *)local_378,(protobuf *)((ulong)pcVar16 & 0xffffffff),i_05);
          io::Printer::Print(pPVar2,"  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
                             "parent",&local_330,"descriptor",&local_350,"index",(string *)local_378
                            );
          std::__cxx11::string::~string((string *)local_378);
          std::__cxx11::string::~string((string *)&local_350);
          std::allocator<char>::~allocator((allocator<char> *)&local_351);
          std::__cxx11::string::~string((string *)&local_330);
        }
        pPVar2 = local_18;
        psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
        io::Printer::Print(pPVar2,"}\n\nprivate static final $classname$[] VALUES = ","classname",
                           psVar7);
        bVar3 = CanUseEnumValues(this);
        if (bVar3) {
          io::Printer::Print(local_18,"values();\n");
        }
        else {
          io::Printer::Print(local_18,"{\n  ");
          for (local_37c = 0; iVar6 = EnumDescriptor::value_count(this->descriptor_),
              pPVar2 = local_18, local_37c < iVar6; local_37c = local_37c + 1) {
            pEVar14 = EnumDescriptor::value(this->descriptor_,local_37c);
            psVar7 = EnumValueDescriptor::name_abi_cxx11_(pEVar14);
            io::Printer::Print(pPVar2,"$name$, ","name",psVar7);
          }
          io::Printer::Print(local_18,"\n};\n");
        }
        pPVar2 = local_18;
        psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
        io::Printer::Print(pPVar2,
                           "\npublic static $classname$ valueOf(\n    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n  if (desc.getType() != getDescriptor()) {\n    throw new java.lang.IllegalArgumentException(\n      \"EnumValueDescriptor is not for this type.\");\n  }\n"
                           ,"classname",psVar7);
        pFVar12 = EnumDescriptor::file(this->descriptor_);
        bVar3 = SupportUnknownEnumValue(pFVar12);
        if (bVar3) {
          io::Printer::Print(local_18,
                             "  if (desc.getIndex() == -1) {\n    return UNRECOGNIZED;\n  }\n");
        }
        io::Printer::Print(local_18,"  return VALUES[desc.getIndex()];\n}\n\n");
        if ((index_text.field_2._M_local_buf[0xb] & 1U) == 0) {
          io::Printer::Print(local_18,"private final int index;\n");
        }
      }
      io::Printer::Print(local_18,"private final int value;\n\n");
      pPVar2 = local_18;
      if ((index_text.field_2._M_local_buf[0xb] & 1U) == 0) {
        psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
        io::Printer::Print(pPVar2,"private $classname$(int index, int value) {\n","classname",psVar7
                          );
      }
      else {
        psVar7 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
        io::Printer::Print(pPVar2,"private $classname$(int value) {\n","classname",psVar7);
      }
      pEVar1 = this->descriptor_;
      bVar3 = Context::EnforceLite(this->context_);
      bVar3 = HasDescriptorMethods(pEVar1,bVar3);
      if ((bVar3) && ((index_text.field_2._M_local_buf[0xb] & 1U) == 0)) {
        io::Printer::Print(local_18,"  this.index = index;\n");
      }
      io::Printer::Print(local_18,"  this.value = value;\n}\n");
      pPVar2 = local_18;
      psVar7 = EnumDescriptor::full_name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(pPVar2,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n",
                         "full_name",psVar7);
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n\n");
      std::__cxx11::string::~string((string *)&i);
      return;
    }
    pcVar16 = (char *)(long)local_78;
    ppEVar9 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->canonical_values_,(size_type)pcVar16);
    pcVar16 = EnumValueDescriptor::index(*ppEVar9,pcVar16,__c);
    if ((int)pcVar16 != local_78) {
      index_text.field_2._M_local_buf[0xb] = '\0';
      std::__cxx11::string::operator=((string *)&i,"index");
      goto LAB_004594f0;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);
  printer->Print(
      "public enum $classname$\n"
      "    implements com.google.protobuf.ProtocolMessageEnum {\n",
      "classname", descriptor_->name());
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  bool ordinal_is_index = true;
  string index_text = "ordinal()";
  for (int i = 0; i < canonical_values_.size(); i++) {
    if (canonical_values_[i]->index() != i) {
      ordinal_is_index = false;
      index_text = "index";
      break;
    }
  }

  for (int i = 0; i < canonical_values_.size(); i++) {
    std::map<string, string> vars;
    vars["name"] = canonical_values_[i]->name();
    vars["index"] = SimpleItoa(canonical_values_[i]->index());
    vars["number"] = SimpleItoa(canonical_values_[i]->number());
    WriteEnumValueDocComment(printer, canonical_values_[i]);
    if (canonical_values_[i]->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    if (ordinal_is_index) {
      printer->Print(vars,
        "$name$($number$),\n");
    } else {
      printer->Print(vars,
        "$name$($index$, $number$),\n");
    }
  }

  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print("UNRECOGNIZED(-1),\n");
    } else {
      printer->Print("UNRECOGNIZED(-1, -1),\n");
    }
  }

  printer->Print(
    ";\n"
    "\n");

  // -----------------------------------------------------------------

  for (int i = 0; i < aliases_.size(); i++) {
    std::map<string, string> vars;
    vars["classname"] = descriptor_->name();
    vars["name"] = aliases_[i].value->name();
    vars["canonical_name"] = aliases_[i].canonical_value->name();
    WriteEnumValueDocComment(printer, aliases_[i].value);
    printer->Print(vars,
      "public static final $classname$ $name$ = $canonical_name$;\n");
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    std::map<string, string> vars;
    vars["name"] = descriptor_->value(i)->name();
    vars["number"] = SimpleItoa(descriptor_->value(i)->number());
    WriteEnumValueDocComment(printer, descriptor_->value(i));
    printer->Print(vars,
      "public static final int $name$_VALUE = $number$;\n");
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
    "\n"
    "public final int getNumber() {\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
    } else {
      printer->Print(
        "  if (index == -1) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
    }
  }
  printer->Print(
    "  return value;\n"
    "}\n"
    "\n"
    "/**\n"
    " * @deprecated Use {@link #forNumber(int)} instead.\n"
    " */\n"
    "@java.lang.Deprecated\n"
    "public static $classname$ valueOf(int value) {\n"
    "  return forNumber(value);\n"
    "}\n"
    "\n"
    "public static $classname$ forNumber(int value) {\n"
    "  switch (value) {\n",
    "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "case $number$: return $name$;\n",
      "name", canonical_values_[i]->name(),
      "number", SimpleItoa(canonical_values_[i]->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "    default: return null;\n"
    "  }\n"
    "}\n"
    "\n"
    "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
    "    internalGetValueMap() {\n"
    "  return internalValueMap;\n"
    "}\n"
    "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
    "    $classname$> internalValueMap =\n"
    "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
    "        public $classname$ findValueByNumber(int number) {\n"
    "          return $classname$.forNumber(number);\n"
    "        }\n"
    "      };\n"
    "\n",
    "classname", descriptor_->name());

  // -----------------------------------------------------------------
  // Reflection

  if (HasDescriptorMethods(descriptor_, context_->EnforceLite())) {
    printer->Print(
      "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n"
      "    getValueDescriptor() {\n"
      "  return getDescriptor().getValues().get($index_text$);\n"
      "}\n"
      "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
      "    getDescriptorForType() {\n"
      "  return getDescriptor();\n"
      "}\n"
      "public static final com.google.protobuf.Descriptors.EnumDescriptor\n"
      "    getDescriptor() {\n",
      "index_text", index_text);

    // TODO(kenton):  Cache statically?  Note that we can't access descriptors
    //   at module init time because it wouldn't work with descriptor.proto, but
    //   we can cache the value the first time getDescriptor() is called.
    if (descriptor_->containing_type() == NULL) {
      // The class generated for the File fully populates the descriptor with
      // extensions in both the mutable and immutable cases. (In the mutable api
      // this is accomplished by attempting to load the immutable outer class).
      printer->Print(
        "  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
        "file", name_resolver_->GetClassName(descriptor_->file(),
                                             immutable_api_),
        "index", SimpleItoa(descriptor_->index()));
    } else {
      printer->Print(
          "  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
          "parent", name_resolver_->GetClassName(descriptor_->containing_type(),
                                                 immutable_api_),
          "descriptor", descriptor_->containing_type()->options()
                        .no_standard_descriptor_accessor()
                        ? "getDefaultInstance().getDescriptorForType()"
                        : "getDescriptor()",
          "index", SimpleItoa(descriptor_->index()));
    }

    printer->Print(
      "}\n"
      "\n"
      "private static final $classname$[] VALUES = ",
      "classname", descriptor_->name());

    if (CanUseEnumValues()) {
      // If the constants we are going to output are exactly the ones we
      // have declared in the Java enum in the same order, then we can use
      // the values() method that the Java compiler automatically generates
      // for every enum.
      printer->Print("values();\n");
    } else {
      printer->Print(
        "{\n"
        "  ");
      for (int i = 0; i < descriptor_->value_count(); i++) {
        printer->Print("$name$, ",
          "name", descriptor_->value(i)->name());
      }
      printer->Print(
          "\n"
          "};\n");
    }

    printer->Print(
      "\n"
      "public static $classname$ valueOf(\n"
      "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n"
      "  if (desc.getType() != getDescriptor()) {\n"
      "    throw new java.lang.IllegalArgumentException(\n"
      "      \"EnumValueDescriptor is not for this type.\");\n"
      "  }\n",
      "classname", descriptor_->name());
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
        "  if (desc.getIndex() == -1) {\n"
        "    return UNRECOGNIZED;\n"
        "  }\n");
    }
    printer->Print(
      "  return VALUES[desc.getIndex()];\n"
      "}\n"
      "\n");

    if (!ordinal_is_index) {
      printer->Print("private final int index;\n");
    }
  }

  // -----------------------------------------------------------------

  printer->Print(
    "private final int value;\n\n");

  if (ordinal_is_index) {
    printer->Print(
      "private $classname$(int value) {\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "private $classname$(int index, int value) {\n",
      "classname", descriptor_->name());
  }
  if (HasDescriptorMethods(descriptor_, context_->EnforceLite()) &&
      !ordinal_is_index) {
    printer->Print("  this.index = index;\n");
  }
  printer->Print(
    "  this.value = value;\n"
    "}\n");

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}